

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O2

void array_container_intersection_inplace(array_container_t *src_1,array_container_t *src_2)

{
  int iVar1;
  int iVar2;
  int32_t iVar3;
  uint uVar4;
  size_t size_l;
  uint16_t *large;
  uint16_t *puVar5;
  uint16_t *buffer;
  size_t s_b;
  size_t s_a;
  
  iVar1 = src_1->cardinality;
  s_a = (size_t)iVar1;
  iVar2 = src_2->cardinality;
  s_b = (size_t)iVar2;
  if (iVar1 * 0x40 < iVar2) {
    puVar5 = src_1->array;
    large = src_2->array;
    size_l = s_b;
    s_b = s_a;
    buffer = puVar5;
  }
  else {
    if (iVar1 <= iVar2 * 0x40) {
      uVar4 = croaring_hardware_support();
      puVar5 = src_1->array;
      if ((uVar4 & 1) == 0) {
        iVar3 = intersect_uint16(puVar5,s_a,src_2->array,s_b,puVar5);
      }
      else {
        iVar3 = intersect_vector16_inplace(puVar5,s_a,src_2->array,s_b);
      }
      goto LAB_00111f65;
    }
    puVar5 = src_2->array;
    large = src_1->array;
    size_l = s_a;
    buffer = large;
  }
  iVar3 = intersect_skewed_uint16(puVar5,s_b,large,size_l,buffer);
LAB_00111f65:
  src_1->cardinality = iVar3;
  return;
}

Assistant:

void array_container_intersection_inplace(array_container_t *src_1,
                                          const array_container_t *src_2) {
    int32_t card_1 = src_1->cardinality, card_2 = src_2->cardinality;
    const int threshold = 64;  // subject to tuning
    if (card_1 * threshold < card_2) {
        src_1->cardinality = intersect_skewed_uint16(
            src_1->array, card_1, src_2->array, card_2, src_1->array);
    } else if (card_2 * threshold < card_1) {
        src_1->cardinality = intersect_skewed_uint16(
            src_2->array, card_2, src_1->array, card_1, src_1->array);
    } else {
#if CROARING_IS_X64
        if (croaring_hardware_support() & ROARING_SUPPORTS_AVX2) {
            src_1->cardinality = intersect_vector16_inplace(
                src_1->array, card_1, src_2->array, card_2);
        } else {
            src_1->cardinality = intersect_uint16(
                src_1->array, card_1, src_2->array, card_2, src_1->array);
        }
#else
        src_1->cardinality = intersect_uint16(
            src_1->array, card_1, src_2->array, card_2, src_1->array);
#endif
    }
}